

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib541.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  stat file_info;
  stat64 local_b0;
  
  if (libtest_arg2 == (char *)0x0) {
    test_cold_6();
  }
  else {
    __stream = fopen64(libtest_arg2,"rb");
    if (__stream == (FILE *)0x0) {
      test_cold_5();
      return -2;
    }
    iVar1 = fileno(__stream);
    iVar1 = fstat64(iVar1,&local_b0);
    if (iVar1 != -1) {
      if (local_b0.st_size == 0) {
        test_cold_3();
        return -4;
      }
      iVar1 = curl_global_init(3);
      if (iVar1 == 0) {
        lVar2 = curl_easy_init();
        if (lVar2 != 0) {
          iVar1 = curl_easy_setopt(lVar2,0x2e,1);
          if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)) &&
              (iVar1 = curl_easy_setopt(lVar2,0x2712,URL), iVar1 == 0)) &&
             (iVar1 = curl_easy_setopt(lVar2,0x2719,__stream), iVar1 == 0)) {
            curl_easy_perform(lVar2);
            iVar1 = curl_easy_perform(lVar2);
          }
          fclose(__stream);
          curl_easy_cleanup(lVar2);
          curl_global_cleanup();
          return iVar1;
        }
        test_cold_2();
      }
      else {
        test_cold_1();
      }
      return 0x7e;
    }
    test_cold_4();
  }
  return -1;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  FILE *hd_src ;
  int hd ;
  struct_stat file_info;
  int error;

  if (!libtest_arg2) {
    fprintf(stderr, "Usage: <url> <file-to-upload>\n");
    return -1;
  }

  hd_src = fopen(libtest_arg2, "rb");
  if(NULL == hd_src) {
    error = ERRNO;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", libtest_arg2);
    return -2; /* if this happens things are major weird */
  }

  /* get the file size of the local file */
  hd = fstat(fileno(hd_src), &file_info);
  if(hd == -1) {
    /* can't open file, bail out */
    error = ERRNO;
    fprintf(stderr, "fstat() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "ERROR: cannot open file %s\n", libtest_arg2);
    fclose(hd_src);
    return -1;
  }

  if(! file_info.st_size) {
    fprintf(stderr, "ERROR: file %s has zero size!\n", libtest_arg2);
    fclose(hd_src);
    return -4;
  }

  if (curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* get a curl handle */
  if ((curl = curl_easy_init()) == NULL) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    fclose(hd_src);
    return TEST_ERR_MAJOR_BAD;
  }

  /* enable uploading */
  test_setopt(curl, CURLOPT_UPLOAD, 1L);

  /* enable verbose */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* specify target */
  test_setopt(curl,CURLOPT_URL, URL);

  /* now specify which file to upload */
  test_setopt(curl, CURLOPT_INFILE, hd_src);

  /* Now run off and do what you've been told! */
  res = curl_easy_perform(curl);

  /* and now upload the exact same again, but without rewinding so it already
     is at end of file */
  res = curl_easy_perform(curl);

test_cleanup:

  /* close the local file */
  fclose(hd_src);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}